

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetra-codec-impl.c
# Opt level: O1

Word32 pow2(tetra_codec *st,Word16 exponant,Word16 fraction)

{
  ushort uVar1;
  uint uVar2;
  Word32 WVar3;
  int iVar4;
  Word32 L_x;
  undefined6 in_register_00000012;
  ulong uVar5;
  uint uVar6;
  short var2;
  long lVar7;
  
  uVar5 = CONCAT62(in_register_00000012,fraction);
  uVar1 = 7;
  do {
    iVar4 = (int)uVar5;
    if (0x3fffffff < iVar4) {
      uVar6 = 0x7fffffff;
LAB_00108916:
      st->Overflow = 1;
      break;
    }
    if (iVar4 < -0x40000000) {
      uVar6 = 0x80000000;
      goto LAB_00108916;
    }
    uVar6 = iVar4 * 2;
    uVar5 = (ulong)uVar6;
    uVar1 = uVar1 - 1;
  } while (1 < uVar1);
  lVar7 = (long)(short)(uVar6 >> 0x10);
  uVar2 = tab_pow2[lVar7] * 0x10000;
  iVar4 = (int)tab_pow2[lVar7] - (int)tab_pow2[lVar7 + 1];
  if (iVar4 < 0x8000) {
    if (iVar4 < -0x8000) {
      st->Overflow = 1;
      iVar4 = -0x8000;
    }
    else {
      st->Overflow = 0;
      iVar4 = (int)(short)iVar4;
    }
  }
  else {
    st->Overflow = 1;
    iVar4 = 0x7fff;
  }
  iVar4 = (uVar6 >> 1 & 0x7fff) * iVar4;
  uVar6 = uVar2 + iVar4 * -2;
  if (((int)(iVar4 * 2 ^ uVar2) < 0) && ((int)(uVar2 ^ uVar6) < 0)) {
    st->Overflow = 1;
    uVar6 = 0x7fffffff;
  }
  iVar4 = 0x7fff;
  if (-0x7fe2 < exponant) {
    iVar4 = 0x1e - (uint)(ushort)exponant;
  }
  st->Overflow = (uint)(exponant < -0x7fe1);
  WVar3 = 0;
  var2 = (short)iVar4;
  if ((var2 < 0x20) && (WVar3 = L_shr(st,uVar6,var2), 0 < var2)) {
    WVar3 = WVar3 + (uint)((uVar6 >> (iVar4 - 1U & 0x1f) & 1) != 0);
  }
  return WVar3;
}

Assistant:

Word32 pow2(tetra_codec* st, Word16 exponant, Word16 fraction)
{
  Word16 exp, i, a, tmp;
  Word32 L_x;

  L_x = L_deposit_l(fraction);
  L_x = L_shl(st, L_x, (Word16)6 );
  i   = extract_h(L_x);				/* Extract b10-b16 of fraction */
  L_x = L_shr(st, L_x, (Word16)1 );
  a   = extract_l(L_x);				/* Extract b0-b9   of fraction */
  a   = a & (Word16)0x7fff;


  L_x = L_deposit_h(tab_pow2[i]);		/* tab_pow2[i] << 16 */
  tmp = sub(st, tab_pow2[i], tab_pow2[i+1]);	/* tab_pow2[i] - tab_pow2[i+1] */
  L_x = L_msu(st, L_x, tmp, a);			/* L_x -= tmp*a*2  */

  exp = sub(st,  (Word16)30, exponant );
  L_x = L_shr_r(st, L_x, exp);
  return(L_x);
}